

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

int ovf::detail::write::increment_n_segments(ovf_file *file)

{
  int __val;
  string padding;
  string new_n_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  fstream filestream;
  ostream local_210 [512];
  
  parse::file_header(file);
  __val = file->n_segments + 1;
  file->n_segments = __val;
  std::__cxx11::to_string(&new_n_str,__val);
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::string::_M_construct((ulong)&padding,'\x06' - (char)new_n_str._M_string_length);
  std::fstream::fstream(&filestream,file->file_name,_S_out|_S_in);
  std::istream::seekg(&filestream,(file->_state->n_segments_pos)._M_off,
                      (file->_state->n_segments_pos)._M_state);
  std::operator+(&local_240,&padding,&new_n_str);
  std::operator<<(local_210,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::fstream::close();
  std::fstream::~fstream(&filestream);
  std::__cxx11::string::~string((string *)&padding);
  std::__cxx11::string::~string((string *)&new_n_str);
  return -1;
}

Assistant:

inline int increment_n_segments(ovf_file *file)
    try
    {
        parse::file_header(*file);

        // Update n_segments
        file->n_segments++;

        // Convert updated n_segment into padded string
        std::string new_n_str = std::to_string( file->n_segments );
        std::string::size_type new_n_len = new_n_str.length();
        std::string::size_type padding_len = n_segments_str_digits - new_n_len;
        std::string padding( padding_len, '0' );

        // Replace n_segments value in the stream
        std::fstream filestream( file->file_name );
        filestream.seekg( file->_state->n_segments_pos );
        filestream << ( padding + new_n_str );
        filestream.close();

        return OVF_OK;
    }
    catch( ... )
    {
        file->_state->message_latest = fmt::format("increment_n_segments failed for file \"{}\".", file->file_name);
        return OVF_ERROR;
    }